

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineMultipleRead.cpp
# Opt level: O2

void testDeepScanLineMultipleRead(string *tempDir)

{
  pointer puVar1;
  int iVar2;
  _Alloc_hider _Var3;
  int i;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 *puVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int y;
  uint uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  uint sample_count;
  int local_168;
  int local_164;
  int local_160;
  float sample;
  float *sample_ptr;
  pointer pfStack_150;
  pointer local_148;
  DeepScanLineOutputFile file;
  vector<unsigned_int,_std::allocator<unsigned_int>_> samplecounts;
  Header header;
  string source_filename;
  DeepFrameBuffer fb;
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting random re-reads from deep scanline file:\n");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator+(&source_filename,tempDir,"imf_test_multiple_read");
  random_reseed(1);
  _Var3 = source_filename._M_dataplus;
  fb._map._M_t._M_impl._0_8_ = 0;
  iVar10 = 0x30;
  Imf_3_2::Header::Header(&header,4,0x30,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar6 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&fb,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar6,(Channel *)0x1ac491);
  puVar7 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar7 = 2;
  Imf_3_2::Header::setType((string *)&header);
  remove(_Var3._M_p);
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile(&file,_Var3._M_p,&header,iVar4);
  sample_ptr = &sample;
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&fb);
  Imf_3_2::Slice::Slice((Slice *)&samplecounts,UINT,(char *)&sample_count,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&samplecounts,FLOAT,(char *)&sample_ptr,0,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)0x1ac491);
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  uVar16 = 0;
  while (bVar17 = iVar10 != 0, iVar10 = iVar10 + -1, bVar17) {
    sample = (float)(int)(uVar16 + 100);
    sample_count = uVar16;
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
    uVar16 = uVar16 + 1;
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&fb);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  _Var3 = source_filename._M_dataplus;
  iVar10 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&sample_count,_Var3._M_p,iVar10);
  Imf_3_2::DeepScanLineInputFile::header();
  piVar8 = (int *)Imf_3_2::Header::dataWindow();
  iVar10 = *piVar8;
  local_168 = piVar8[1];
  iVar4 = piVar8[2];
  iVar2 = piVar8[3];
  iVar12 = 0;
  if (iVar2 >= local_168 && iVar4 >= iVar10) {
    iVar12 = iVar4 - iVar10;
  }
  local_164 = (iVar2 - local_168) + 1;
  if (iVar2 < local_168 || iVar4 < iVar10) {
    local_164 = 1;
  }
  Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::channels();
  lVar9 = Imf_3_2::ChannelList::begin();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&samplecounts,(long)(iVar12 + 1),(allocator_type *)&fb);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            ((vector<float_*,_std::allocator<float_*>_> *)&file,(long)(iVar12 + 1),
             (allocator_type *)&fb);
  sample_ptr = (float *)0x0;
  pfStack_150 = (pointer)0x0;
  local_148 = (pointer)0x0;
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&fb);
  Imf_3_2::Slice::Slice
            ((Slice *)&header,UINT,
             (char *)(samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + -(long)iVar10),4,0,1,1,0.0,false,
             false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&header,FLOAT,(char *)((long)iVar10 * -8 + _file),8,0,4,1,1,0.0,false,
             false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)(lVar9 + 0x20));
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&sample_count);
  lVar11 = (long)iVar12;
  lVar9 = -1;
  if (-1 < lVar11) {
    lVar9 = lVar11;
  }
  iVar10 = 0;
  do {
    if (iVar10 == 4000) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&fb);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&sample_ptr);
      std::_Vector_base<float_*,_std::allocator<float_*>_>::~_Vector_base
                ((_Vector_base<float_*,_std::allocator<float_*>_> *)&file);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&sample_count)
      ;
      remove(source_filename._M_dataplus._M_p);
      poVar5 = std::operator<<((ostream *)&std::cout," ok\n");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&source_filename);
      return;
    }
    local_160 = iVar10;
    iVar10 = random_int(local_164);
    uVar15 = iVar10 + local_168;
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&sample_count,uVar15);
    uVar16 = 0;
    for (lVar13 = 0; lVar9 + 1 != lVar13; lVar13 = lVar13 + 1) {
      if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] != uVar15) {
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar13);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar15);
        poVar5 = std::operator<<(poVar5," error, sample counts should be ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar15);
        poVar5 = std::operator<<(poVar5,", is ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ostream::flush();
        if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13] != uVar15) {
          __assert_fail("samplecounts[i] == static_cast<unsigned int> (row)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                        ,0x9b,"void (anonymous namespace)::read_file(const char *)");
        }
      }
      uVar16 = uVar16 + uVar15;
    }
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&sample_ptr,(long)(int)uVar16);
    lVar13 = 0;
    for (iVar10 = 0; (lVar13 <= lVar11 && (iVar10 < (int)uVar16)); iVar10 = iVar10 + *puVar1) {
      *(float **)(_file + lVar13 * 8) = sample_ptr + iVar10;
      puVar1 = samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar13;
      lVar13 = lVar13 + 1;
    }
    Imf_3_2::DeepScanLineInputFile::readPixels((int)&sample_count,uVar15);
    fVar18 = (float)(int)uVar15 + 100.0;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    uVar14 = 0;
    while (uVar16 != uVar14) {
      fVar19 = sample_ptr[uVar14];
      if ((fVar19 != fVar18) || (NAN(fVar19) || NAN(fVar18))) {
        poVar5 = std::operator<<((ostream *)&std::cout," sample ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar14);
        poVar5 = std::operator<<(poVar5," on row ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar15);
        poVar5 = std::operator<<(poVar5," error, shuold be ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar18);
        poVar5 = std::operator<<(poVar5," got ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sample_ptr[uVar14]);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ostream::flush();
        fVar19 = sample_ptr[uVar14];
      }
      uVar14 = uVar14 + 1;
      if ((fVar19 != fVar18) || (NAN(fVar19) || NAN(fVar18))) {
        __assert_fail("samples[i] == row + 100.f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                      ,0xbe,"void (anonymous namespace)::read_file(const char *)");
      }
    }
    iVar10 = local_160 + 1;
  } while( true );
}

Assistant:

void
testDeepScanLineMultipleRead (const std::string& tempDir)
{

    cout << "\n\nTesting random re-reads from deep scanline file:\n" << endl;

    std::string source_filename = tempDir + "imf_test_multiple_read";
    random_reseed (1);

    make_file (source_filename.c_str ());
    read_file (source_filename.c_str ());
    remove (source_filename.c_str ());

    cout << " ok\n" << endl;
}